

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)17>_> *
vkt::wsi::anon_unknown_0::TriangleRenderer::createRenderPass
          (Move<vk::Handle<(vk::HandleType)17>_> *__return_storage_ptr__,DeviceInterface *vkd,
          VkDevice device,VkFormat colorAttachmentFormat)

{
  undefined1 local_118 [8];
  VkRenderPassCreateInfo renderPassParams;
  VkSubpassDependency dependencies [2];
  undefined1 local_98 [4];
  undefined4 local_94;
  VkSubpassDescription subpassDesc;
  VkAttachmentReference colorAttRef;
  VkAttachmentDescription colorAttDesc;
  VkFormat colorAttachmentFormat_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  
  colorAttRef.attachment = 0;
  subpassDesc.pPreserveAttachments = (deUint32 *)0x200000000;
  colorAttRef.layout = colorAttachmentFormat;
  memset(local_98,0,0x48);
  local_94 = 0;
  subpassDesc.pInputAttachments._0_4_ = 1;
  subpassDesc._24_8_ = &subpassDesc.pPreserveAttachments;
  memcpy(&renderPassParams.pDependencies,&DAT_0132f930,0x38);
  local_118._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext._0_4_ = 0;
  renderPassParams.pNext._4_4_ = 1;
  renderPassParams._16_8_ = &colorAttRef;
  renderPassParams.pAttachments._0_4_ = 1;
  renderPassParams._32_8_ = local_98;
  renderPassParams.pSubpasses._0_4_ = 2;
  renderPassParams._48_8_ = &renderPassParams.pDependencies;
  ::vk::createRenderPass
            (__return_storage_ptr__,vkd,device,(VkRenderPassCreateInfo *)local_118,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkRenderPass> TriangleRenderer::createRenderPass (const DeviceInterface&	vkd,
													   const VkDevice			device,
													   const VkFormat			colorAttachmentFormat)
{
	const VkAttachmentDescription	colorAttDesc		=
	{
		(VkAttachmentDescriptionFlags)0,
		colorAttachmentFormat,
		VK_SAMPLE_COUNT_1_BIT,
		VK_ATTACHMENT_LOAD_OP_CLEAR,
		VK_ATTACHMENT_STORE_OP_STORE,
		VK_ATTACHMENT_LOAD_OP_DONT_CARE,
		VK_ATTACHMENT_STORE_OP_DONT_CARE,
		VK_IMAGE_LAYOUT_UNDEFINED,
		VK_IMAGE_LAYOUT_PRESENT_SRC_KHR,
	};
	const VkAttachmentReference		colorAttRef			=
	{
		0u,
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
	};
	const VkSubpassDescription		subpassDesc			=
	{
		(VkSubpassDescriptionFlags)0u,
		VK_PIPELINE_BIND_POINT_GRAPHICS,
		0u,							// inputAttachmentCount
		DE_NULL,					// pInputAttachments
		1u,							// colorAttachmentCount
		&colorAttRef,				// pColorAttachments
		DE_NULL,					// pResolveAttachments
		DE_NULL,					// depthStencilAttachment
		0u,							// preserveAttachmentCount
		DE_NULL,					// pPreserveAttachments
	};
	const VkSubpassDependency		dependencies[]		=
	{
		{
			VK_SUBPASS_EXTERNAL,	// srcSubpass
			0u,						// dstSubpass
			VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT,
			VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT,
			VK_ACCESS_MEMORY_READ_BIT,
			(VK_ACCESS_COLOR_ATTACHMENT_READ_BIT|
			 VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT),
			VK_DEPENDENCY_BY_REGION_BIT
		},
		{
			0u,						// srcSubpass
			VK_SUBPASS_EXTERNAL,	// dstSubpass
			VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT,
			VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT,
			(VK_ACCESS_COLOR_ATTACHMENT_READ_BIT|
			 VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT),
			VK_ACCESS_MEMORY_READ_BIT,
			VK_DEPENDENCY_BY_REGION_BIT
		},
	};
	const VkRenderPassCreateInfo	renderPassParams	=
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,
		DE_NULL,
		(VkRenderPassCreateFlags)0,
		1u,
		&colorAttDesc,
		1u,
		&subpassDesc,
		DE_LENGTH_OF_ARRAY(dependencies),
		dependencies,
	};

	return vk::createRenderPass(vkd, device, &renderPassParams);
}